

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrEnumerateViveTrackerPathsHTCX
                   (XrInstance instance,uint32_t pathCapacityInput,uint32_t *pathCountOutput,
                   XrViveTrackerPathsHTCX *paths)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  long lVar3;
  XrResult XVar4;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  XrInstance_T *in_stack_fffffffffffffd58;
  allocator local_29a;
  allocator local_299;
  string local_298;
  GenValidUsageXrInstanceInfo *local_278;
  string local_270;
  XrInstance instance_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_228;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 1;
  instance_local = instance;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrInstance_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&instance_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrInstanceHandle(&instance_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    local_278 = HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                          (&g_instance_info.
                            super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,
                           instance_local);
    if (paths == (XrViveTrackerPathsHTCX *)0x0 && pathCapacityInput != 0) {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrEnumerateViveTrackerPathsHTCX-paths-parameter",
                 (allocator *)&local_228);
      std::__cxx11::string::string
                ((string *)&local_298,"xrEnumerateViveTrackerPathsHTCX",&local_299);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1d8,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_270,
                 "Command xrEnumerateViveTrackerPathsHTCX param paths is NULL, but pathCapacityInput is greater than 0"
                 ,&local_29a);
      CoreValidLogMessage(local_278,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_298,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1d8,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      this = &local_1d8;
    }
    else if (pathCountOutput == (uint32_t *)0x0) {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrEnumerateViveTrackerPathsHTCX-pathCountOutput-parameter",
                 (allocator *)&local_228);
      std::__cxx11::string::string
                ((string *)&local_298,"xrEnumerateViveTrackerPathsHTCX",&local_299);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1f0,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_270,
                 "Invalid NULL for uint32_t \"pathCountOutput\" which is not optional and must be non-NULL"
                 ,&local_29a);
      CoreValidLogMessage(local_278,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_298,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1f0,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      this = &local_1f0;
    }
    else {
      if (paths == (XrViveTrackerPathsHTCX *)0x0) {
        XVar4 = XR_SUCCESS;
        goto LAB_001df64e;
      }
      lVar3 = (ulong)pathCapacityInput + 1;
      XVar4 = XR_SUCCESS;
      do {
        lVar3 = lVar3 + -1;
        if (lVar3 == 0) goto LAB_001df64e;
        std::__cxx11::string::string
                  ((string *)&oss,"xrEnumerateViveTrackerPathsHTCX",(allocator *)&local_298);
        XVar2 = ValidateXrStruct(local_278,(string *)&oss,&objects_info,false,true,paths);
        paths = paths + 1;
        std::__cxx11::string::~string((string *)&oss);
      } while (XVar2 == XR_SUCCESS);
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrEnumerateViveTrackerPathsHTCX-paths-parameter",
                 (allocator *)&local_228);
      std::__cxx11::string::string
                ((string *)&local_298,"xrEnumerateViveTrackerPathsHTCX",&local_299);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_208,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_270,
                 "Command xrEnumerateViveTrackerPathsHTCX param paths is invalid",&local_29a);
      CoreValidLogMessage(local_278,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_298,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_208,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      this = &local_208;
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&oss);
    XVar4 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrInstance handle \"instance\" ");
    HandleToHexString<XrInstance_T*>(in_stack_fffffffffffffd58);
    std::operator<<((ostream *)&oss,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::string
              ((string *)&local_298,"VUID-xrEnumerateViveTrackerPathsHTCX-instance-parameter",
               &local_299);
    std::__cxx11::string::string((string *)&local_270,"xrEnumerateViveTrackerPathsHTCX",&local_29a);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1c0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_298,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_270,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1c0,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1c0);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar4 = XR_ERROR_HANDLE_INVALID;
  }
LAB_001df64e:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar4;
}

Assistant:

XrResult GenValidUsageInputsXrEnumerateViveTrackerPathsHTCX(
XrInstance instance,
uint32_t pathCapacityInput,
uint32_t* pathCountOutput,
XrViveTrackerPathsHTCX* paths) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(instance, XR_OBJECT_TYPE_INSTANCE);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrInstanceHandle(&instance);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrInstance handle \"instance\" ";
                oss << HandleToHexString(instance);
                CoreValidLogMessage(nullptr, "VUID-xrEnumerateViveTrackerPathsHTCX-instance-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateViveTrackerPathsHTCX",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        (void)gen_instance_info;  // quiet warnings
        // Optional array must be non-NULL when pathCapacityInput is non-zero
        if (0 != pathCapacityInput && nullptr == paths) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateViveTrackerPathsHTCX-paths-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateViveTrackerPathsHTCX",
                                objects_info,
                                "Command xrEnumerateViveTrackerPathsHTCX param paths is NULL, but pathCapacityInput is greater than 0");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == pathCountOutput) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateViveTrackerPathsHTCX-pathCountOutput-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateViveTrackerPathsHTCX", objects_info,
                                "Invalid NULL for uint32_t \"pathCountOutput\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrEnumerateViveTrackerPathsHTCX-pathCountOutput-parameter" type
        if (paths) {
            for (uint32_t value_paths_inc = 0; value_paths_inc < pathCapacityInput; ++value_paths_inc) {
                // Validate that the structure XrViveTrackerPathsHTCX is valid
                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateViveTrackerPathsHTCX", objects_info,
                                                                true, true, &paths[value_paths_inc]);
                if (XR_SUCCESS != xr_result) {
                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateViveTrackerPathsHTCX-paths-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateViveTrackerPathsHTCX",
                                        objects_info,
                                        "Command xrEnumerateViveTrackerPathsHTCX param paths is invalid");
                    return xr_result;
                }
            }
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}